

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

psolver_t btSoftBody::getSolver(_ solver)

{
  _ solver_local;
  psolver_t local_8;
  
  switch(solver) {
  case Linear:
    local_8 = PSolve_Links;
    break;
  case Anchors:
    local_8 = PSolve_Anchors;
    break;
  case RContacts:
    local_8 = PSolve_RContacts;
    break;
  case SContacts:
    local_8 = PSolve_SContacts;
    break;
  default:
    local_8 = (psolver_t)0x0;
  }
  return local_8;
}

Assistant:

btSoftBody::psolver_t	btSoftBody::getSolver(ePSolver::_ solver)
{
	switch(solver)
	{
	case	ePSolver::Anchors:		
		return(&btSoftBody::PSolve_Anchors);
	case	ePSolver::Linear:		
		return(&btSoftBody::PSolve_Links);
	case	ePSolver::RContacts:	
		return(&btSoftBody::PSolve_RContacts);
	case	ePSolver::SContacts:	
		return(&btSoftBody::PSolve_SContacts);	
		default:
		{
		}
	}
	return(0);
}